

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

int Curl_cpool_check_limits(Curl_easy *data,connectdata *conn)

{
  cpool *cpool_00;
  cpool_bundle *bundle_00;
  size_t sVar1;
  connectdata *pcVar2;
  bool bVar3;
  connectdata *oldest_idle_1;
  connectdata *oldest_idle;
  ulong uStack_40;
  int result;
  size_t total_limit;
  size_t dest_limit;
  cpool_bundle *bundle;
  cpool *cpool;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cpool_00 = cpool_get_instance(data);
  total_limit = 0;
  uStack_40 = 0;
  oldest_idle._4_4_ = 0;
  if (cpool_00 == (cpool *)0x0) {
    return 0;
  }
  if ((data != (Curl_easy *)0x0) && (data->multi != (Curl_multi *)0x0)) {
    total_limit = data->multi->max_host_connections;
    uStack_40 = data->multi->max_total_connections;
  }
  if ((total_limit == 0) && (uStack_40 == 0)) {
    return 0;
  }
  if (cpool_00 != (cpool *)0x0) {
    if ((cpool_00->share != (Curl_share *)0x0) && ((cpool_00->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool_00->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool_00->field_0x98 = cpool_00->field_0x98 & 0xfe | 1;
  }
  if (total_limit != 0) {
    bundle_00 = cpool_find_bundle(cpool_00,conn);
    while( true ) {
      bVar3 = false;
      if (bundle_00 != (cpool_bundle *)0x0) {
        sVar1 = Curl_llist_count(&bundle_00->conns);
        bVar3 = total_limit <= sVar1;
      }
      if ((!bVar3) ||
         (pcVar2 = cpool_bundle_get_oldest_idle(bundle_00), pcVar2 == (connectdata *)0x0)) break;
      Curl_cpool_disconnect(data,pcVar2,false);
    }
    if ((bundle_00 != (cpool_bundle *)0x0) &&
       (sVar1 = Curl_llist_count(&bundle_00->conns), total_limit <= sVar1)) {
      oldest_idle._4_4_ = 1;
      goto LAB_0011fd57;
    }
  }
  if (uStack_40 != 0) {
    while ((uStack_40 <= cpool_00->num_conn &&
           (pcVar2 = cpool_get_oldest_idle(cpool_00), pcVar2 != (connectdata *)0x0))) {
      Curl_cpool_disconnect(data,pcVar2,false);
    }
    if (uStack_40 <= cpool_00->num_conn) {
      oldest_idle._4_4_ = 2;
    }
  }
LAB_0011fd57:
  if (((cpool_00 != (cpool *)0x0) &&
      (cpool_00->field_0x98 = cpool_00->field_0x98 & 0xfe, cpool_00->share != (Curl_share *)0x0)) &&
     ((cpool_00->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool_00->idata,CURL_LOCK_DATA_CONNECT);
  }
  return oldest_idle._4_4_;
}

Assistant:

int Curl_cpool_check_limits(struct Curl_easy *data,
                            struct connectdata *conn)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  size_t dest_limit = 0;
  size_t total_limit = 0;
  int result = CPOOL_LIMIT_OK;

  if(!cpool)
    return CPOOL_LIMIT_OK;

  if(data && data->multi) {
    dest_limit = data->multi->max_host_connections;
    total_limit = data->multi->max_total_connections;
  }

  if(!dest_limit && !total_limit)
    return CPOOL_LIMIT_OK;

  CPOOL_LOCK(cpool);
  if(dest_limit) {
    bundle = cpool_find_bundle(cpool, conn);
    while(bundle && (Curl_llist_count(&bundle->conns) >= dest_limit)) {
      struct connectdata *oldest_idle = NULL;
      /* The bundle is full. Extract the oldest connection that may
       * be removed now, if there is one. */
      oldest_idle = cpool_bundle_get_oldest_idle(bundle);
      if(!oldest_idle)
        break;
      /* disconnect the old conn and continue */
      DEBUGF(infof(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach destination "
                   "limit of %zu", oldest_idle->connection_id,
                   Curl_llist_count(&bundle->conns), dest_limit));
      Curl_cpool_disconnect(data, oldest_idle, FALSE);
    }
    if(bundle && (Curl_llist_count(&bundle->conns) >= dest_limit)) {
      result = CPOOL_LIMIT_DEST;
      goto out;
    }
  }

  if(total_limit) {
    while(cpool->num_conn >= total_limit) {
      struct connectdata *oldest_idle = cpool_get_oldest_idle(cpool);
      if(!oldest_idle)
        break;
      /* disconnect the old conn and continue */
      DEBUGF(infof(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach total "
                   "limit of %zu",
                   oldest_idle->connection_id, cpool->num_conn, total_limit));
      Curl_cpool_disconnect(data, oldest_idle, FALSE);
    }
    if(cpool->num_conn >= total_limit) {
      result = CPOOL_LIMIT_TOTAL;
      goto out;
    }
  }

out:
  CPOOL_UNLOCK(cpool);
  return result;
}